

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffread(FITSfile *fptr,long nbytes,void *buffer,int *status)

{
  int iVar1;
  int *in_RCX;
  void *in_RDX;
  long in_RSI;
  int *in_RDI;
  int readstatus;
  
  iVar1 = (*driverTable[in_RDI[1]].read)(*in_RDI,in_RDX,in_RSI);
  if (iVar1 == 0x6b) {
    *in_RCX = 0x6b;
  }
  else if (0 < iVar1) {
    ffpmsg((char *)0x113e37);
    ffpmsg((char *)0x113e45);
    *in_RCX = 0x6c;
  }
  return *in_RCX;
}

Assistant:

int ffread( FITSfile *fptr,   /* I - FITS file pointer              */
            long nbytes,      /* I - number of bytes to read        */
            void *buffer,     /* O - buffer to read into            */
            int *status)      /* O - error status                   */
/*
  low level routine to read bytes from a file.
*/
{
    int readstatus;

    readstatus = (*driverTable[fptr->driver].read)(fptr->filehandle, 
        buffer, nbytes);

    if (readstatus == END_OF_FILE)
        *status = END_OF_FILE;
    else if (readstatus > 0)
    {
        ffpmsg("Error reading data buffer from file:");
	ffpmsg(fptr->filename);

        *status = READ_ERROR;
    }

    return(*status);
}